

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O2

string * __thiscall
CppGenerator::outputAggRegTupleString_abi_cxx11_
          (string *__return_storage_ptr__,CppGenerator *this,AggregateIndexes *idx,size_t numOfAggs,
          bitset<7UL> *increasing,size_t stringOffset,bool postLoop)

{
  size_t sVar1;
  ulong uVar2;
  ulong uVar3;
  string k;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string local_88;
  string local_68;
  CppGenerator *local_48;
  size_t local_40;
  ulong local_38;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&k);
  local_38 = numOfAggs + 1;
  if (local_38 < 3) {
    local_48 = this;
    local_40 = stringOffset;
    for (uVar3 = 0; local_38 != uVar3; uVar3 = uVar3 + 1) {
      if (postLoop) {
        offset_abi_cxx11_(&local_68,local_48,local_40);
        std::operator+(&local_c8,&local_68,"aggregateRegister[");
        std::__cxx11::to_string(&local_88,idx->indexes[7] + uVar3);
        std::operator+(&local_a8,&local_c8,&local_88);
        std::operator+(&k,&local_a8,"] = ");
        std::__cxx11::string::append((string *)__return_storage_ptr__);
      }
      else {
        offset_abi_cxx11_(&local_68,local_48,local_40);
        std::operator+(&local_c8,&local_68,"aggregateRegister[");
        std::__cxx11::to_string(&local_88,idx->indexes[7] + uVar3);
        std::operator+(&local_a8,&local_c8,&local_88);
        std::operator+(&k,&local_a8,"] += ");
        std::__cxx11::string::append((string *)__return_storage_ptr__);
      }
      std::__cxx11::string::~string((string *)&k);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&local_c8);
      std::__cxx11::string::~string((string *)&local_68);
      uVar2 = (idx->present).super__Base_bitset<1UL>._M_w;
      if ((uVar2 & 1) != 0) {
        std::__cxx11::to_string
                  (&local_c8,
                   (-(ulong)((uint)(increasing->super__Base_bitset<1UL>)._M_w & 1) & uVar3) +
                   idx->indexes[0]);
        std::operator+(&local_a8,"aggregateRegister[",&local_c8);
        std::operator+(&k,&local_a8,"]*");
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)&k);
        std::__cxx11::string::~string((string *)&local_a8);
        std::__cxx11::string::~string((string *)&local_c8);
        uVar2 = (idx->present).super__Base_bitset<1UL>._M_w;
      }
      if ((uVar2 & 2) != 0) {
        std::__cxx11::to_string
                  (&local_c8,
                   ((long)((increasing->super__Base_bitset<1UL>)._M_w << 0x3e) >> 0x3f & uVar3) +
                   idx->indexes[1]);
        std::operator+(&local_a8,"localRegister[",&local_c8);
        std::operator+(&k,&local_a8,"]*");
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)&k);
        std::__cxx11::string::~string((string *)&local_a8);
        std::__cxx11::string::~string((string *)&local_c8);
        uVar2 = (idx->present).super__Base_bitset<1UL>._M_w;
      }
      if ((uVar2 & 4) != 0) {
        std::__cxx11::to_string
                  (&local_c8,
                   ((long)((increasing->super__Base_bitset<1UL>)._M_w << 0x3d) >> 0x3f & uVar3) +
                   idx->indexes[2]);
        std::operator+(&local_a8,"viewRegister[",&local_c8);
        std::operator+(&k,&local_a8,"]*");
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)&k);
        std::__cxx11::string::~string((string *)&local_a8);
        std::__cxx11::string::~string((string *)&local_c8);
        uVar2 = (idx->present).super__Base_bitset<1UL>._M_w;
      }
      if ((uVar2 & 8) != 0) {
        uVar2 = (increasing->super__Base_bitset<1UL>)._M_w;
        if ((uVar2 & 8) != 0) {
          std::operator<<((ostream *)&std::cerr,"VIEW ID SHOULD NEVER INCREASE!!! \n");
          goto LAB_001b937c;
        }
        sVar1 = idx->indexes[4];
        std::operator+(&local_68,"aggregates_",local_48->viewName + idx->indexes[3]);
        std::operator+(&local_c8,&local_68,"[");
        std::__cxx11::to_string(&local_88,((long)(uVar2 << 0x3b) >> 0x3f & uVar3) + sVar1);
        std::operator+(&local_a8,&local_c8,&local_88);
        std::operator+(&k,&local_a8,"]*");
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)&k);
        std::__cxx11::string::~string((string *)&local_a8);
        std::__cxx11::string::~string((string *)&local_88);
        std::__cxx11::string::~string((string *)&local_c8);
        std::__cxx11::string::~string((string *)&local_68);
        uVar2 = (idx->present).super__Base_bitset<1UL>._M_w;
      }
      if ((uVar2 & 0x20) != 0) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        uVar2 = (idx->present).super__Base_bitset<1UL>._M_w;
      }
      if ((uVar2 & 0x40) != 0) {
        std::__cxx11::to_string
                  (&local_c8,
                   ((long)((increasing->super__Base_bitset<1UL>)._M_w << 0x39) >> 0x3f & uVar3) +
                   idx->indexes[6]);
        std::operator+(&local_a8,"aggregateRegister[",&local_c8);
        std::operator+(&k,&local_a8,"]*");
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)&k);
        std::__cxx11::string::~string((string *)&local_a8);
        std::__cxx11::string::~string((string *)&local_c8);
      }
      std::__cxx11::string::pop_back();
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
  }
  else {
    offset_abi_cxx11_(&local_68,this,stringOffset);
    std::operator+(&local_c8,&local_68,"for (size_t i = 0; i < ");
    std::__cxx11::to_string(&local_88,local_38);
    std::operator+(&local_a8,&local_c8,&local_88);
    std::operator+(&k,&local_a8,";++i)\n");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&k);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_68);
    if (postLoop) {
      offset_abi_cxx11_(&local_68,this,stringOffset + 1);
      std::operator+(&local_c8,&local_68,"aggregateRegister[");
      std::__cxx11::to_string(&local_88,idx->indexes[7]);
      std::operator+(&local_a8,&local_c8,&local_88);
      std::operator+(&k,&local_a8,"+i] = ");
      std::__cxx11::string::append((string *)__return_storage_ptr__);
    }
    else {
      offset_abi_cxx11_(&local_68,this,stringOffset + 1);
      std::operator+(&local_c8,&local_68,"aggregateRegister[");
      std::__cxx11::to_string(&local_88,idx->indexes[7]);
      std::operator+(&local_a8,&local_c8,&local_88);
      std::operator+(&k,&local_a8,"+i] += ");
      std::__cxx11::string::append((string *)__return_storage_ptr__);
    }
    std::__cxx11::string::~string((string *)&k);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_68);
    uVar3 = (idx->present).super__Base_bitset<1UL>._M_w;
    if ((uVar3 & 1) != 0) {
      std::__cxx11::to_string(&k,idx->indexes[0]);
      if (((increasing->super__Base_bitset<1UL>)._M_w & 1) != 0) {
        std::__cxx11::string::append((char *)&k);
      }
      std::operator+(&local_c8,"aggregateRegister[",&k);
      std::operator+(&local_a8,&local_c8,"]*");
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_c8);
      std::__cxx11::string::~string((string *)&k);
      uVar3 = (idx->present).super__Base_bitset<1UL>._M_w;
    }
    if ((uVar3 & 2) != 0) {
      std::__cxx11::to_string(&k,idx->indexes[1]);
      if (((increasing->super__Base_bitset<1UL>)._M_w & 2) != 0) {
        std::__cxx11::string::append((char *)&k);
      }
      std::operator+(&local_c8,"localRegister[",&k);
      std::operator+(&local_a8,&local_c8,"]*");
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_c8);
      std::__cxx11::string::~string((string *)&k);
      uVar3 = (idx->present).super__Base_bitset<1UL>._M_w;
    }
    if ((uVar3 & 4) != 0) {
      std::__cxx11::to_string(&k,idx->indexes[2]);
      if (((increasing->super__Base_bitset<1UL>)._M_w & 4) != 0) {
        std::__cxx11::string::append((char *)&k);
      }
      std::operator+(&local_c8,"viewRegister[",&k);
      std::operator+(&local_a8,&local_c8,"]*");
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_c8);
      std::__cxx11::string::~string((string *)&k);
      uVar3 = (idx->present).super__Base_bitset<1UL>._M_w;
    }
    if ((uVar3 & 8) != 0) {
      if (((increasing->super__Base_bitset<1UL>)._M_w & 8) != 0) {
        std::operator<<((ostream *)&std::cerr,"VIEW ID SHOULD NEVER INCREASE!!! \n");
LAB_001b937c:
        exit(1);
      }
      sVar1 = idx->indexes[3];
      std::__cxx11::to_string(&k,idx->indexes[4]);
      if (((increasing->super__Base_bitset<1UL>)._M_w & 0x10) != 0) {
        std::__cxx11::string::append((char *)&k);
      }
      std::operator+(&local_88,"aggregates_",this->viewName + sVar1);
      std::operator+(&local_68,&local_88,"[");
      std::operator+(&local_c8,&local_68,&k);
      std::operator+(&local_a8,&local_c8,"]*");
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_c8);
      std::__cxx11::string::~string((string *)&local_68);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&k);
      uVar3 = (idx->present).super__Base_bitset<1UL>._M_w;
    }
    if ((uVar3 & 0x20) != 0) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      uVar3 = (idx->present).super__Base_bitset<1UL>._M_w;
    }
    if ((uVar3 & 0x40) != 0) {
      std::__cxx11::to_string(&k,idx->indexes[6]);
      if (((increasing->super__Base_bitset<1UL>)._M_w & 0x40) != 0) {
        std::__cxx11::string::append((char *)&k);
      }
      std::operator+(&local_c8,"aggregateRegister[",&k);
      std::operator+(&local_a8,&local_c8,"]*");
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_c8);
      std::__cxx11::string::~string((string *)&k);
    }
    std::__cxx11::string::pop_back();
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CppGenerator::outputAggRegTupleString(
    AggregateIndexes& idx, size_t numOfAggs, const std::bitset<7>& increasing,
    size_t stringOffset, bool postLoop)
{  
    std::string outString = "";
    
    if (numOfAggs+1 > LOOPIFY_THRESHOLD)
    {
        outString += offset(stringOffset)+
            "for (size_t i = 0; i < "+std::to_string(numOfAggs+1)+";++i)\n";

        if (postLoop)
            outString += offset(stringOffset+1)+
                "aggregateRegister["+std::to_string(idx.indexes[7])+"+i] = ";
        else 
            outString += offset(stringOffset+1)+
                "aggregateRegister["+std::to_string(idx.indexes[7])+"+i] += ";

        if (idx.present[0])
        {
            std::string k = std::to_string(idx.indexes[0]);
            if (increasing[0])
                k += "+i";
            outString +="aggregateRegister["+k+"]*";
        }

        if (idx.present[1])
        {
            std::string k = std::to_string(idx.indexes[1]);
            if (increasing[1])
                k += "+i";
            outString +="localRegister["+k+"]*";
        }

        if (idx.present[2])
        {
            std::string k = std::to_string(idx.indexes[2]);
            if (increasing[2])
                k += "+i";
            outString +="viewRegister["+k+"]*";
        }
        if (idx.present[3])
        {
            // TODO: CHECK THAT index 4 is also presenth
            size_t viewID = idx.indexes[3];                
            if (increasing[3])
            {
                ERROR("VIEW ID SHOULD NEVER INCREASE!!! \n");
                exit(1);
            }
            
            std::string aggID = std::to_string(idx.indexes[4]);
            if (increasing[4])
                aggID += "+i";

            outString += "aggregates_"+viewName[viewID]+"["+aggID+"]*";
        }

        if (idx.present[5])
            outString +=  "count*";

        if (idx.present[6])
        {
            std::string k = std::to_string(idx.indexes[6]);            
            if (increasing[6])
                k += "+i";
            outString += "aggregateRegister["+k+"]*";
        }

        outString.pop_back();
        outString += ";\n";
    }
    else
    {
        // Print out all aggregates individually
        for (size_t i = 0; i < numOfAggs+1; ++i)
        {
            // We use a mapping to the correct index
            if (postLoop)
                outString += offset(stringOffset)+
                    "aggregateRegister["+std::to_string(idx.indexes[7]+i)+"] = ";
            else
                outString += offset(stringOffset)+
                    "aggregateRegister["+std::to_string(idx.indexes[7]+i)+"] += ";

            if (idx.present[0])
            {
                size_t k = idx.indexes[0];
                if (increasing[0])
                    k += i;
                outString +="aggregateRegister["+std::to_string(k)+"]*";
            }

            if (idx.present[1])
            {
                size_t k = idx.indexes[1];
                if (increasing[1])
                    k += i;
                outString +="localRegister["+std::to_string(k)+"]*";
            }

            if (idx.present[2])
            {
                size_t k = idx.indexes[2];
                if (increasing[2])
                    k += i;
                outString +="viewRegister["+std::to_string(k)+"]*";
            }
            if (idx.present[3])
            {
                // TODO: CHECK THAT index 4 is also presenth
                size_t viewID = idx.indexes[3];                
                if (increasing[3])
                {
                    ERROR("VIEW ID SHOULD NEVER INCREASE!!! \n");
                    exit(1);
                }

                size_t aggID = idx.indexes[4];
                if (increasing[4])
                    aggID += i;

                outString += "aggregates_"+viewName[viewID]+"["+
                    std::to_string(aggID)+"]*";
            }

            if (idx.present[5])
                outString +=  "count*";

            if (idx.present[6])
            {
                size_t k = idx.indexes[6];
                if (increasing[6])
                    k += i;
                outString += "aggregateRegister["+std::to_string(k)+"]*";
            }

            outString.pop_back();
            outString += ";\n";
        }
    }

    return outString;
}